

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ctcmsa_mipsel(CPUMIPSState_conflict4 *env,target_ulong_conflict elm,uint32_t cd)

{
  byte bVar1;
  uint32_t unaff_retaddr;
  
  if (cd == 1) {
    (env->active_tc).msacsr = elm & 0x107ffff;
    bVar1 = (byte)(elm >> 0x18) & 1;
    (env->active_tc).msa_fp_status.float_rounding_mode = (char)ieee_rm_mipsel[elm & 3];
    (env->active_tc).msa_fp_status.flush_to_zero = bVar1;
    (env->active_tc).msa_fp_status.flush_inputs_to_zero = bVar1;
    if (((elm >> 7 & 0x1f | 0x20) & elm >> 0xc) != 0) {
      do_raise_exception(env,unaff_retaddr,(uintptr_t)ieee_rm_mipsel);
    }
  }
  return;
}

Assistant:

void helper_msa_ctcmsa(CPUMIPSState *env, target_ulong elm, uint32_t cd)
{
    switch (cd) {
    case 0:
        break;
    case 1:
        env->active_tc.msacsr = (int32_t)elm & MSACSR_MASK;
        restore_msa_fp_status(env);
        /* check exception */
        if ((GET_FP_ENABLE(env->active_tc.msacsr) | FP_UNIMPLEMENTED)
            & GET_FP_CAUSE(env->active_tc.msacsr)) {
            do_raise_exception(env, EXCP_MSAFPE, GETPC());
        }
        break;
    }
}